

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int stream_less(void *lhsx,void *rhsx)

{
  ulong uVar1;
  bool bVar2;
  
  uVar1 = *(long *)((long)rhsx + 0x48) - *(long *)((long)lhsx + 0x48);
  if (uVar1 == 0) {
    bVar2 = *(ulong *)((long)lhsx + 0x58) < *(ulong *)((long)rhsx + 0x58);
  }
  else {
    bVar2 = uVar1 >> 0x20 == 0;
  }
  return (int)bVar2;
}

Assistant:

static int stream_less(const void *lhsx, const void *rhsx) {
  const nghttp2_stream *lhs, *rhs;

  lhs = nghttp2_struct_of(lhsx, nghttp2_stream, pq_entry);
  rhs = nghttp2_struct_of(rhsx, nghttp2_stream, pq_entry);

  if (lhs->cycle == rhs->cycle) {
    return lhs->seq < rhs->seq;
  }

  return rhs->cycle - lhs->cycle <= NGHTTP2_STREAM_MAX_CYCLE_GAP;
}